

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

bool __thiscall
Shell::Options::OptionValue<Shell::Options::ProofExtra>::checkProblemConstraints
          (OptionValue<Shell::Options::ProofExtra> *this,Property *prop)

{
  bool bVar1;
  uint uVar2;
  Mode MVar3;
  BadOption BVar4;
  pointer pOVar5;
  undefined8 uVar6;
  ostream *poVar7;
  undefined8 in_RSI;
  long in_RDI;
  OptionProblemConstraintUP *con;
  RefIterator it;
  string *in_stack_ffffffffffffff08;
  UserErrorException *in_stack_ffffffffffffff10;
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar8;
  undefined1 local_a0 [112];
  unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
  *local_30;
  RefIterator local_28;
  undefined8 local_18;
  
  local_18 = in_RSI;
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  ::RefIterator::RefIterator
            (&local_28,
             (Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
              *)(in_RDI + 0xc0));
  do {
    do {
      bVar1 = Lib::
              Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
              ::RefIterator::hasNext(&local_28);
      if (!bVar1) {
        return true;
      }
      local_30 = Lib::
                 Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
                 ::RefIterator::next(&local_28);
    } while ((*(byte *)(in_RDI + 0x69) & 1) == 0);
    pOVar5 = std::
             unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
             ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                           *)0xc6aba2);
    uVar2 = (**pOVar5->_vptr_OptionProblemConstraint)(pOVar5,local_18);
  } while ((uVar2 & 1) != 0);
  MVar3 = mode(Lib::env);
  if (MVar3 != SPIDER) {
    BVar4 = getBadOptionChoice(Lib::env);
    if (BVar4 != OFF) {
      poVar7 = std::operator<<((ostream *)&std::cout,"% WARNING: ");
      poVar7 = std::operator<<(poVar7,(string *)(in_RDI + 8));
      pOVar5 = std::
               unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
               ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                             *)0xc6ad50);
      (*pOVar5->_vptr_OptionProblemConstraint[1])();
      poVar7 = std::operator<<(poVar7,local_c8);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_c8);
    }
    return false;
  }
  reportSpiderFail();
  uVar8 = 1;
  uVar6 = __cxa_allocate_exception(0x50);
  std::operator+((char *)CONCAT17(uVar8,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50);
  pOVar5 = std::
           unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
           ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                         *)0xc6ac17);
  (*pOVar5->_vptr_OptionProblemConstraint[1])(local_a0);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Lib::UserErrorException::Exception(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException)
  ;
}

Assistant:

bool Options::OptionValue<T>::checkProblemConstraints(Property* prop){
    Lib::Stack<OptionProblemConstraintUP>::RefIterator it(_prob_constraints);
    while(it.hasNext()){
      OptionProblemConstraintUP& con = it.next();
      // Constraint should hold whenever the option is set
      if(is_set && !con->check(prop)){

         if (env.options->mode() == Mode::SPIDER){
           reportSpiderFail();
           USER_ERROR("% WARNING: " + longName + con->msg());
         }

         switch(env.options->getBadOptionChoice()){
         case BadOption::OFF: break;
         default:
           cout << "% WARNING: " << longName << con->msg() << endl;
         }
         return false;
      }
    }
    return true;
}